

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool __thiscall Enumerated::Decode(Enumerated *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  length_error *this_00;
  size_t sVar2;
  size_t local_30;
  size_t size;
  size_t cbPrefix;
  
  local_30 = 0;
  size = 0;
  bVar1 = CheckDecode(pIn,cbIn,Enumerated,&local_30,&size);
  if (bVar1) {
    if (local_30 + size != 3) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"Incorrect decode");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    this->value = pIn[2];
    sVar2 = 3;
  }
  else {
    sVar2 = 0;
  }
  *cbUsed = sVar2;
  return bVar1;
}

Assistant:

virtual bool Decode(const unsigned char* pIn, size_t cbIn, size_t& cbUsed) override
	{
		size_t size = 0;
		size_t cbPrefix = 0;
		if (!CheckDecode(pIn, cbIn, DerType::Enumerated, size, cbPrefix))
		{
			cbUsed = 0;
			return false;
		}

		// Now check specifics for this type
		if (cbPrefix + size != 3)
			throw std::length_error("Incorrect decode");

		value = pIn[2];
		cbUsed = 3;
		return true;
	}